

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseResidency.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::BufferSparseResidencyCase::initPrograms
          (BufferSparseResidencyCase *this,SourceCollections *sourceCollections)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *this_00;
  string local_220;
  ShaderSource local_200;
  allocator<char> local_1d1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream src;
  deUint32 iterationsCount;
  char *versionDecl;
  SourceCollections *sourceCollections_local;
  BufferSparseResidencyCase *this_local;
  
  pcVar2 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  uVar1 = this->m_bufferSize;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar3 = std::operator<<(poVar3,"layout(set = 0, binding = 0, std430) readonly buffer Input\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tuint data[];\n");
  poVar3 = std::operator<<(poVar3,"} sb_in;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(set = 0, binding = 1, std430) writeonly buffer Output\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tuint result[];\n");
  poVar3 = std::operator<<(poVar3,"} sb_out;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tfor(int i=0; i<");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1 >> 2);
  poVar3 = std::operator<<(poVar3,"; ++i) \n");
  poVar3 = std::operator<<(poVar3,"\t{\n");
  poVar3 = std::operator<<(poVar3,"\t\tsb_out.result[i] = sb_in.data[i];");
  poVar3 = std::operator<<(poVar3,"\t}\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"comp",&local_1d1);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1d0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_200,&local_220);
  glu::ProgramSources::operator<<(this_00,&local_200);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void BufferSparseResidencyCase::initPrograms (SourceCollections& sourceCollections) const
{
	const char* const	versionDecl		= glu::getGLSLVersionDeclaration(m_glslVersion);
	const deUint32		iterationsCount = m_bufferSize / SIZE_OF_UINT_IN_SHADER;

	std::ostringstream src;

	src << versionDecl << "\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout(set = 0, binding = 0, std430) readonly buffer Input\n"
		<< "{\n"
		<< "	uint data[];\n"
		<< "} sb_in;\n"
		<< "\n"
		<< "layout(set = 0, binding = 1, std430) writeonly buffer Output\n"
		<< "{\n"
		<< "	uint result[];\n"
		<< "} sb_out;\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	for(int i=0; i<" << iterationsCount << "; ++i) \n"
		<< "	{\n"
		<< "		sb_out.result[i] = sb_in.data[i];"
		<< "	}\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}